

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engrave.c
# Opt level: O0

int freehand(void)

{
  int iVar1;
  byte local_b;
  byte local_a;
  byte local_9;
  
  local_9 = 1;
  if (uwep != (obj *)0x0) {
    iVar1 = welded(uwep);
    local_9 = 1;
    if (iVar1 != 0) {
      if (((uwep->oclass != '\x02') && (uwep->oclass != '\x06')) ||
         (local_a = 0, (*(ushort *)&objects[uwep->otyp].field_0x11 & 1) == 0)) {
        local_b = 1;
        if (uarms != (obj *)0x0) {
          local_b = (*(uint *)&uarms->field_0x4a & 1) != 0 ^ 0xff;
        }
        local_a = local_b;
      }
      local_9 = local_a;
    }
  }
  return (int)(local_9 & 1);
}

Assistant:

int freehand(void)
{
	return(!uwep || !welded(uwep) ||
	   (!bimanual(uwep) && (!uarms || !uarms->cursed)));
/*	if ((uwep && bimanual(uwep)) ||
	    (uwep && uarms))
		return 0;
	else
		return 1;*/
}